

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_71(QPDF *pdf,char *arg2)

{
  _Rb_tree_header *p_Var1;
  reference pvVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar5;
  allocator<char> local_2db;
  allocator<char> local_2da;
  allocator<char> local_2d9;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  local_2d8;
  string local_2a8 [32];
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_288;
  string local_278 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_270;
  string local_268 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_260;
  string local_258 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_250;
  value_type page;
  QPDFPageObjectHelper fx1;
  string local_1d8 [32];
  _Any_data local_1b8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  _Any_data local_198;
  code *local_188;
  code *local_180;
  _Any_data local_178;
  undefined8 local_168;
  undefined8 uStack_160;
  _Any_data local_158;
  code *local_148;
  code *local_140;
  _Any_data local_138;
  code *local_128;
  code *local_120;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  _Any_data local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&fx1,pdf);
  QPDFPageDocumentHelper::getAllPages();
  pvVar2 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::at
                     ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                      &local_2d8,0);
  QPDFPageObjectHelper::QPDFPageObjectHelper(&page,pvVar2);
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_2d8);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&fx1);
  poVar3 = std::operator<<((ostream *)&std::cout,"--- recursive, all ---");
  std::endl<char,std::char_traits<char>>(poVar3);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc:2438:17)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc:2438:17)>
             ::_M_manager;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = 0;
  uStack_60 = 0;
  QPDFPageObjectHelper::forEachXObject(&page,1);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  poVar3 = std::operator<<((ostream *)&std::cout,"--- non-recursive, all ---");
  std::endl<char,std::char_traits<char>>(poVar3);
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_80 = std::
             _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc:2438:17)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc:2438:17)>
             ::_M_manager;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  QPDFPageObjectHelper::forEachXObject(&page,0);
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  poVar3 = std::operator<<((ostream *)&std::cout,"--- recursive, images ---");
  std::endl<char,std::char_traits<char>>(poVar3);
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c0 = std::
             _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc:2438:17)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc:2438:17)>
             ::_M_manager;
  QPDFPageObjectHelper::forEachImage(&page,1);
  std::_Function_base::~_Function_base((_Function_base *)&local_d8);
  poVar3 = std::operator<<((ostream *)&std::cout,"--- non-recursive, images ---");
  std::endl<char,std::char_traits<char>>(poVar3);
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc:2438:17)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc:2438:17)>
             ::_M_manager;
  QPDFPageObjectHelper::forEachImage(&page,0);
  std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  poVar3 = std::operator<<((ostream *)&std::cout,"--- recursive, form XObjects ---");
  std::endl<char,std::char_traits<char>>(poVar3);
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc:2438:17)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc:2438:17)>
              ::_M_manager;
  QPDFPageObjectHelper::forEachFormXObject(&page,1);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  poVar3 = std::operator<<((ostream *)&std::cout,"--- non-recursive, form XObjects ---");
  std::endl<char,std::char_traits<char>>(poVar3);
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  local_120 = std::
              _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc:2438:17)>
              ::_M_invoke;
  local_128 = std::
              _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc:2438:17)>
              ::_M_manager;
  QPDFPageObjectHelper::forEachFormXObject(&page,0);
  std::_Function_base::~_Function_base((_Function_base *)&local_138);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_288,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&page.field_0x8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"/Resources",&local_2d9);
  QPDFObjectHandle::getKey(local_278);
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"/XObject",&local_2da);
  QPDFObjectHandle::getKey(local_268);
  std::__cxx11::string::string<std::allocator<char>>(local_1d8,"/Fx1",&local_2db);
  QPDFObjectHandle::getKey(local_258);
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_258;
  QPDFPageObjectHelper::QPDFPageObjectHelper(&fx1,QVar5);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_250);
  std::__cxx11::string::~string(local_1d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_260);
  std::__cxx11::string::~string(local_2a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_270);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_288._M_refcount);
  poVar3 = std::operator<<((ostream *)&std::cout,"--- recursive, all, from fx1 ---");
  std::endl<char,std::char_traits<char>>(poVar3);
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140 = std::
              _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc:2438:17)>
              ::_M_invoke;
  local_148 = std::
              _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc:2438:17)>
              ::_M_manager;
  local_178._M_unused._M_object = (void *)0x0;
  local_178._8_8_ = 0;
  local_168 = 0;
  uStack_160 = 0;
  QPDFPageObjectHelper::forEachXObject(&fx1,1);
  std::_Function_base::~_Function_base((_Function_base *)&local_178);
  std::_Function_base::~_Function_base((_Function_base *)&local_158);
  poVar3 = std::operator<<((ostream *)&std::cout,"--- non-recursive, all, from fx1 ---");
  std::endl<char,std::char_traits<char>>(poVar3);
  local_198._M_unused._M_object = (void *)0x0;
  local_198._8_8_ = 0;
  local_180 = std::
              _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc:2438:17)>
              ::_M_invoke;
  local_188 = std::
              _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc:2438:17)>
              ::_M_manager;
  local_1b8._M_unused._M_object = (void *)0x0;
  local_1b8._8_8_ = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  QPDFPageObjectHelper::forEachXObject(&fx1,0);
  std::_Function_base::~_Function_base((_Function_base *)&local_1b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_198);
  poVar3 = std::operator<<((ostream *)&std::cout,"--- get images, page ---");
  std::endl<char,std::char_traits<char>>(poVar3);
  QPDFPageObjectHelper::getImages_abi_cxx11_();
  p_Var1 = &local_2d8._M_impl.super__Rb_tree_header;
  for (p_Var4 = local_2d8._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var1; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)(p_Var4 + 1));
    poVar3 = std::operator<<(poVar3," -> ");
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,local_2a8);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string(local_2a8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  ::~_Rb_tree(&local_2d8);
  poVar3 = std::operator<<((ostream *)&std::cout,"--- get images, fx ---");
  std::endl<char,std::char_traits<char>>(poVar3);
  QPDFPageObjectHelper::getImages_abi_cxx11_();
  for (p_Var4 = local_2d8._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var1; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)(p_Var4 + 1));
    poVar3 = std::operator<<(poVar3," -> ");
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,local_2a8);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string(local_2a8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  ::~_Rb_tree(&local_2d8);
  poVar3 = std::operator<<((ostream *)&std::cout,"--- get form XObjects, page ---");
  std::endl<char,std::char_traits<char>>(poVar3);
  QPDFPageObjectHelper::getFormXObjects_abi_cxx11_();
  for (p_Var4 = local_2d8._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var1; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)(p_Var4 + 1));
    poVar3 = std::operator<<(poVar3," -> ");
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,local_2a8);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string(local_2a8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  ::~_Rb_tree(&local_2d8);
  poVar3 = std::operator<<((ostream *)&std::cout,"--- get form XObjects, fx ---");
  std::endl<char,std::char_traits<char>>(poVar3);
  QPDFPageObjectHelper::getFormXObjects_abi_cxx11_();
  for (p_Var4 = local_2d8._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var1; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)(p_Var4 + 1));
    poVar3 = std::operator<<(poVar3," -> ");
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,local_2a8);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string(local_2a8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  ::~_Rb_tree(&local_2d8);
  QPDFPageObjectHelper::~QPDFPageObjectHelper(&fx1);
  QPDFPageObjectHelper::~QPDFPageObjectHelper(&page);
  return;
}

Assistant:

static void
test_71(QPDF& pdf, char const* arg2)
{
    auto show = [](QPDFObjectHandle& obj, QPDFObjectHandle& xobj_dict, std::string const& key) {
        std::cout << xobj_dict.unparse() << " -> " << key << " -> " << obj.unparse() << std::endl;
    };
    auto page = QPDFPageDocumentHelper(pdf).getAllPages().at(0);
    std::cout << "--- recursive, all ---" << std::endl;
    page.forEachXObject(true, show);
    std::cout << "--- non-recursive, all ---" << std::endl;
    page.forEachXObject(false, show);
    std::cout << "--- recursive, images ---" << std::endl;
    page.forEachImage(true, show);
    std::cout << "--- non-recursive, images ---" << std::endl;
    page.forEachImage(false, show);
    std::cout << "--- recursive, form XObjects ---" << std::endl;
    page.forEachFormXObject(true, show);
    std::cout << "--- non-recursive, form XObjects ---" << std::endl;
    page.forEachFormXObject(false, show);
    auto fx1 = QPDFPageObjectHelper(
        page.getObjectHandle().getKey("/Resources").getKey("/XObject").getKey("/Fx1"));
    std::cout << "--- recursive, all, from fx1 ---" << std::endl;
    fx1.forEachXObject(true, show);
    std::cout << "--- non-recursive, all, from fx1 ---" << std::endl;
    fx1.forEachXObject(false, show);
    std::cout << "--- get images, page ---" << std::endl;
    for (auto& i: page.getImages()) {
        std::cout << i.first << " -> " << i.second.unparse() << std::endl;
    }
    std::cout << "--- get images, fx ---" << std::endl;
    for (auto& i: fx1.getImages()) {
        std::cout << i.first << " -> " << i.second.unparse() << std::endl;
    }
    std::cout << "--- get form XObjects, page ---" << std::endl;
    for (auto& i: page.getFormXObjects()) {
        std::cout << i.first << " -> " << i.second.unparse() << std::endl;
    }
    std::cout << "--- get form XObjects, fx ---" << std::endl;
    for (auto& i: fx1.getFormXObjects()) {
        std::cout << i.first << " -> " << i.second.unparse() << std::endl;
    }
}